

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::Material
          (ParsedScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  FileLoc loc_00;
  size_type sVar1;
  SceneEntity *in_RDX;
  ParameterDictionary *in_RSI;
  FileLoc *in_RDI;
  ParameterDictionary dict;
  ParameterDictionary *in_stack_fffffffffffffd98;
  value_type *__x;
  ParameterDictionary *in_stack_fffffffffffffda0;
  SceneEntity *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffda8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffdb0;
  string *name_00;
  char *fmt;
  RGBColorSpace *in_stack_fffffffffffffde8;
  ParsedParameterVector *in_stack_fffffffffffffdf0;
  ParsedParameterVector *in_stack_fffffffffffffdf8;
  ParameterDictionary *in_stack_fffffffffffffe00;
  string local_e0 [6];
  ParameterDictionary *local_10;
  
  fmt = &stack0x00000008;
  if (*(int *)&in_RDI[0x59].filename._M_str == 2) {
    Error<char_const(&)[9]>(in_RDI,fmt,(char (*) [9])in_RDX);
  }
  else if (*(int *)&in_RDI[0x59].filename._M_str == 0) {
    Error<char_const(&)[9]>(in_RDI,fmt,(char (*) [9])in_RDX);
  }
  else {
    name_00 = local_e0;
    local_10 = in_RSI;
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    ParameterDictionary::ParameterDictionary
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffde8);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&in_stack_fffffffffffffda0->params);
    ParameterDictionary::ParameterDictionary(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    __x = *(value_type **)fmt;
    this_00 = *(SceneEntity **)(fmt + 8);
    loc_00.filename._M_str = (char *)__x;
    loc_00.filename._M_len = (size_t)in_RDI;
    loc_00._16_8_ = this_00;
    SceneEntity::SceneEntity(in_RDX,name_00,local_10,loc_00);
    std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::push_back
              ((vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *)this_00,__x);
    SceneEntity::~SceneEntity(this_00);
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9cffcb);
    sVar1 = std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::size
                      ((vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *)
                       &in_RDI[0x4d].filename._M_str);
    *(int *)(*(long *)&in_RDI[0x72].line + 0x40) = (int)sVar1 + -1;
    std::__cxx11::string::clear();
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9d0011);
  }
  return;
}

Assistant:

void ParsedScene::Material(const std::string &name, ParsedParameterVector params,
                           FileLoc loc) {
    VERIFY_WORLD("Material");
    ParameterDictionary dict(std::move(params), graphicsState->materialAttributes,
                             graphicsState->colorSpace);
    materials.push_back(SceneEntity(name, std::move(dict), loc));
    graphicsState->currentMaterialIndex = materials.size() - 1;
    graphicsState->currentMaterialName.clear();
}